

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_graph.c
# Opt level: O2

void glist_sort(_glist *x)

{
  bool bVar1;
  t_gobj *ptVar2;
  int in_EDX;
  int extraout_EDX;
  t_gobj **pptVar3;
  uint uVar4;
  t_gobj **pptVar5;
  float fVar6;
  t_float tVar7;
  
  bVar1 = false;
  uVar4 = 0;
  pptVar3 = &x->gl_list;
  pptVar5 = pptVar3;
  fVar6 = -1e+37;
  while (ptVar2 = *pptVar5, ptVar2 != (t_gobj *)0x0) {
    tVar7 = gobj_getxforsort(ptVar2);
    if (tVar7 < fVar6) {
      bVar1 = true;
    }
    uVar4 = uVar4 + 1;
    in_EDX = extraout_EDX;
    fVar6 = tVar7;
    pptVar5 = &ptVar2->g_next;
  }
  if (bVar1) {
    ptVar2 = glist_dosort((_glist *)*pptVar3,(t_gobj *)(ulong)uVar4,in_EDX);
    *pptVar3 = ptVar2;
  }
  return;
}

Assistant:

void glist_sort(t_glist *x)
{
    int nitems = 0, foo = 0;
    t_float lastx = -1e37;
    t_gobj *g;
    for (g = x->gl_list; g; g = g->g_next)
    {
        t_float x1 = gobj_getxforsort(g);
        if (x1 < lastx)
            foo = 1;
        lastx = x1;
        nitems++;
    }
    if (foo)
        x->gl_list = glist_dosort(x, x->gl_list, nitems);
}